

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffsetstringarray_p.h
# Opt level: O2

View __thiscall
QOffsetStringArray<std::array<char,_203UL>,_std::array<unsigned_char,_27UL>_>::viewAt
          (QOffsetStringArray<std::array<char,_203UL>,_std::array<unsigned_char,_27UL>_> *this,
          qsizetype index)

{
  array<unsigned_char,_27UL> *this_00;
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  View VVar4;
  
  this_00 = &this->m_offsets;
  pbVar3 = std::array<unsigned_char,_27UL>::operator[](this_00,index);
  bVar1 = *pbVar3;
  pbVar3 = std::array<unsigned_char,_27UL>::operator[](this_00,index + 1);
  bVar2 = *pbVar3;
  pbVar3 = std::array<unsigned_char,_27UL>::operator[](this_00,index);
  VVar4.m_size = ~(ulong)*pbVar3 + (ulong)bVar2;
  VVar4.m_data = (this->m_string)._M_elems + bVar1;
  return VVar4;
}

Assistant:

constexpr View viewAt(qsizetype index) const noexcept
    {
        return { m_string.data() + m_offsets[index],
                    qsizetype(m_offsets[index + 1]) - qsizetype(m_offsets[index]) - 1 };
    }